

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O0

void UCNV_FROM_U_CALLBACK_ESCAPE_63
               (void *context,UConverterFromUnicodeArgs *fromArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  void *local_d0;
  void *ignoredContext;
  UConverterFromUCallback ignoredCallback;
  void *originalContext;
  UConverterFromUCallback original;
  UChar *pUStack_a8;
  UErrorCode err2;
  UChar *myValueSource;
  int32_t i;
  int32_t valueStringLength;
  UChar valueString [48];
  UConverterCallbackReason reason_local;
  UChar32 codePoint_local;
  int32_t length_local;
  UChar *codeUnits_local;
  UConverterFromUnicodeArgs *fromArgs_local;
  void *context_local;
  
  myValueSource._4_4_ = 0;
  myValueSource._0_4_ = 0;
  pUStack_a8 = (UChar *)0x0;
  original._4_4_ = U_ZERO_ERROR;
  originalContext = (void *)0x0;
  ignoredContext = (void *)0x0;
  if ((int)reason < 3) {
    if ((reason == UCNV_UNASSIGNED) &&
       (((((((codePoint == 0xad || (codePoint == 0x34f)) || (codePoint == 0x61c)) ||
           ((codePoint == 0x115f || (codePoint == 0x1160)))) ||
          (((0x17b3 < codePoint && (codePoint < 0x17b6)) ||
           ((0x180a < codePoint && (codePoint < 0x180f)))))) ||
         (((((0x200a < codePoint && (codePoint < 0x2010)) ||
            ((((0x2029 < codePoint && (codePoint < 0x202f)) ||
              ((0x205f < codePoint && (codePoint < 0x2070)))) || (codePoint == 0x3164)))) ||
           ((((0xfdff < codePoint && (codePoint < 0xfe10)) || (codePoint == 0xfeff)) ||
            ((codePoint == 0xffa0 || ((0xffef < codePoint && (codePoint < 0xfff9)))))))) ||
          ((0x1bc9f < codePoint && (codePoint < 0x1bca4)))))) ||
        (((0x1d172 < codePoint && (codePoint < 0x1d17b)) ||
         ((0xdffff < codePoint && (codePoint < 0xe1000)))))))) {
      *err = U_ZERO_ERROR;
    }
    else {
      ucnv_setFromUCallBack_63
                (fromArgs->converter,UCNV_FROM_U_CALLBACK_SUBSTITUTE_63,(void *)0x0,
                 (UConverterFromUCallback *)&originalContext,&ignoredCallback,
                 (UErrorCode *)((long)&original + 4));
      UVar1 = U_FAILURE(original._4_4_);
      if (UVar1 == '\0') {
        if (context == (void *)0x0) {
          while ((int)myValueSource < length) {
            iVar3 = myValueSource._4_4_ + 1;
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x25;
            myValueSource._4_4_ = myValueSource._4_4_ + 2;
            *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x55;
            lVar4 = (long)(int)myValueSource;
            myValueSource._0_4_ = (int)myValueSource + 1;
            iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                 0x30 - myValueSource._4_4_,(uint)(ushort)codeUnits[lVar4],0x10,4);
            myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
          }
        }
        else {
          switch(*context) {
          case 0x43:
            iVar3 = myValueSource._4_4_ + 1;
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x5c;
            if (length == 2) {
              myValueSource._4_4_ = myValueSource._4_4_ + 2;
              *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x55;
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,codePoint,0x10,8);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            else {
              myValueSource._4_4_ = myValueSource._4_4_ + 2;
              *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x75;
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)*codeUnits,0x10,4);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            break;
          case 0x44:
            iVar3 = myValueSource._4_4_ + 1;
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x26;
            myValueSource._4_4_ = myValueSource._4_4_ + 2;
            *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x23;
            if (length == 2) {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,codePoint,10,0);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            else {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)*codeUnits,10,0);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x3b;
            myValueSource._4_4_ = myValueSource._4_4_ + 1;
            break;
          default:
            while ((int)myValueSource < length) {
              iVar3 = myValueSource._4_4_ + 1;
              *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x25;
              myValueSource._4_4_ = myValueSource._4_4_ + 2;
              *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x55;
              lVar4 = (long)(int)myValueSource;
              myValueSource._0_4_ = (int)myValueSource + 1;
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)codeUnits[lVar4],0x10,4)
              ;
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            break;
          case 0x4a:
            while ((int)myValueSource < length) {
              iVar3 = myValueSource._4_4_ + 1;
              *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x5c;
              myValueSource._4_4_ = myValueSource._4_4_ + 2;
              *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x75;
              lVar4 = (long)(int)myValueSource;
              myValueSource._0_4_ = (int)myValueSource + 1;
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)codeUnits[lVar4],0x10,4)
              ;
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            break;
          case 0x53:
            iVar3 = myValueSource._4_4_ + 1;
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x5c;
            myValueSource._4_4_ = iVar3;
            iVar2 = uprv_itou_63((UChar *)((long)&i + (long)iVar3 * 2),0x30 - iVar3,codePoint,0x10,0
                                );
            *(undefined2 *)((long)&i + (long)(iVar2 + myValueSource._4_4_) * 2) = 0x20;
            myValueSource._4_4_ = iVar2 + myValueSource._4_4_ + 1;
            break;
          case 0x55:
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x7b;
            iVar3 = myValueSource._4_4_ + 2;
            *(undefined2 *)((long)&i + (long)(myValueSource._4_4_ + 1) * 2) = 0x55;
            myValueSource._4_4_ = myValueSource._4_4_ + 3;
            *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x2b;
            if (length == 2) {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,codePoint,0x10,4);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            else {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)*codeUnits,0x10,4);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x7d;
            myValueSource._4_4_ = myValueSource._4_4_ + 1;
            break;
          case 0x58:
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x26;
            iVar3 = myValueSource._4_4_ + 2;
            *(undefined2 *)((long)&i + (long)(myValueSource._4_4_ + 1) * 2) = 0x23;
            myValueSource._4_4_ = myValueSource._4_4_ + 3;
            *(undefined2 *)((long)&i + (long)iVar3 * 2) = 0x78;
            if (length == 2) {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,codePoint,0x10,0);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            else {
              iVar2 = uprv_itou_63((UChar *)((long)&i + (long)myValueSource._4_4_ * 2),
                                   0x30 - myValueSource._4_4_,(uint)(ushort)*codeUnits,0x10,0);
              myValueSource._4_4_ = iVar2 + myValueSource._4_4_;
            }
            *(undefined2 *)((long)&i + (long)myValueSource._4_4_ * 2) = 0x3b;
            myValueSource._4_4_ = myValueSource._4_4_ + 1;
          }
        }
        pUStack_a8 = (UChar *)&i;
        *err = U_ZERO_ERROR;
        ucnv_cbFromUWriteUChars_63
                  (fromArgs,&stack0xffffffffffffff58,pUStack_a8 + myValueSource._4_4_,0,err);
        ucnv_setFromUCallBack_63
                  (fromArgs->converter,(UConverterFromUCallback)originalContext,ignoredCallback,
                   (UConverterFromUCallback *)&ignoredContext,&local_d0,
                   (UErrorCode *)((long)&original + 4));
        UVar1 = U_FAILURE(original._4_4_);
        if (UVar1 != '\0') {
          *err = original._4_4_;
        }
      }
      else {
        *err = original._4_4_;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_ESCAPE (
                         const void *context,
                         UConverterFromUnicodeArgs *fromArgs,
                         const UChar *codeUnits,
                         int32_t length,
                         UChar32 codePoint,
                         UConverterCallbackReason reason,
                         UErrorCode * err)
{

  UChar valueString[VALUE_STRING_LENGTH];
  int32_t valueStringLength = 0;
  int32_t i = 0;

  const UChar *myValueSource = NULL;
  UErrorCode err2 = U_ZERO_ERROR;
  UConverterFromUCallback original = NULL;
  const void *originalContext;

  UConverterFromUCallback ignoredCallback = NULL;
  const void *ignoredContext;
  
  if (reason > UCNV_IRREGULAR)
  {
      return;
  }
  else if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
  {
      /*
       * Skip if the codepoint has unicode property of default ignorable.
       */
      *err = U_ZERO_ERROR;
      return;
  }

  ucnv_setFromUCallBack (fromArgs->converter,
                     (UConverterFromUCallback) UCNV_FROM_U_CALLBACK_SUBSTITUTE,
                     NULL,
                     &original,
                     &originalContext,
                     &err2);
  
  if (U_FAILURE (err2))
  {
    *err = err2;
    return;
  } 
  if(context==NULL)
  { 
      while (i < length)
      {
        valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
        valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
        valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
      }
  }
  else
  {
      switch(*((char*)context))
      {
      case UCNV_PRV_ESCAPE_JAVA:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_C:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */

          if(length==2){
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 8);

          }
          else{
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_XML_DEC:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 10, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 10, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_XML_HEX:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          valueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_UNICODE:
          valueString[valueStringLength++] = (UChar) UNICODE_LEFT_CURLY_CODEPOINT;    /* adding { */
          valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;    /* adding U */
          valueString[valueStringLength++] = (UChar) UNICODE_PLUS_CODEPOINT; /* adding + */
          if (length == 2) {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 4);
          } else {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_RIGHT_CURLY_CODEPOINT;    /* adding } */
          break;

      case UCNV_PRV_ESCAPE_CSS2:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
          valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          /* Always add space character, becase the next character might be whitespace,
             which would erroneously be considered the termination of the escape sequence. */
          valueString[valueStringLength++] = (UChar) UNICODE_SPACE_CODEPOINT;
          break;

      default:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;             /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
      }
  }  
  myValueSource = valueString;

  /* reset the error */
  *err = U_ZERO_ERROR;

  ucnv_cbFromUWriteUChars(fromArgs, &myValueSource, myValueSource+valueStringLength, 0, err);

  ucnv_setFromUCallBack (fromArgs->converter,
                         original,
                         originalContext,
                         &ignoredCallback,
                         &ignoredContext,
                         &err2);
  if (U_FAILURE (err2))
  {
      *err = err2;
      return;
  }

  return;
}